

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_add(JSON_Array *array,JSON_Value *value)

{
  JSON_Status JVar1;
  JSON_Value *pJVar2;
  JSON_Array *in_RSI;
  JSON_Array *in_RDI;
  size_t new_capacity;
  size_t local_28;
  
  if (in_RDI->capacity <= in_RDI->count) {
    if (in_RDI->capacity * 2 < 0x11) {
      local_28 = 0x10;
    }
    else {
      local_28 = in_RDI->capacity << 1;
    }
    JVar1 = json_array_resize(in_RSI,local_28);
    if (JVar1 != 0) {
      return -1;
    }
  }
  pJVar2 = json_array_get_wrapping_value(in_RDI);
  in_RSI->wrapping_value = pJVar2;
  in_RDI->items[in_RDI->count] = (JSON_Value *)in_RSI;
  in_RDI->count = in_RDI->count + 1;
  return 0;
}

Assistant:

static JSON_Status json_array_add(JSON_Array *array, JSON_Value *value) {
    if (array->count >= array->capacity) {
        size_t new_capacity = MAX(array->capacity * 2, STARTING_CAPACITY);
        if (json_array_resize(array, new_capacity) != JSONSuccess) {
            return JSONFailure;
        }
    }
    value->parent = json_array_get_wrapping_value(array);
    array->items[array->count] = value;
    array->count++;
    return JSONSuccess;
}